

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_nameMatchesAscii(ENCODING *enc,char *ptr1,char *end1,char *ptr2)

{
  long lVar1;
  
  lVar1 = (long)end1 - (long)ptr1;
  while( true ) {
    if (*ptr2 == '\0') {
      return (uint)(ptr1 == end1);
    }
    if (lVar1 < 2) {
      return 0;
    }
    if (*ptr1 != '\0') {
      return 0;
    }
    if (ptr1[1] != *ptr2) break;
    ptr1 = ptr1 + 2;
    ptr2 = ptr2 + 1;
    lVar1 = lVar1 + -2;
  }
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(nameMatchesAscii)(const ENCODING *enc, const char *ptr1,
                         const char *end1, const char *ptr2) {
  UNUSED_P(enc);
  for (; *ptr2; ptr1 += MINBPC(enc), ptr2++) {
    if (end1 - ptr1 < MINBPC(enc)) {
      /* This line cannot be executed.  The incoming data has already
       * been tokenized once, so incomplete characters like this have
       * already been eliminated from the input.  Retaining the
       * paranoia check is still valuable, however.
       */
      return 0; /* LCOV_EXCL_LINE */
    }
    if (! CHAR_MATCHES(enc, ptr1, *ptr2))
      return 0;
  }
  return ptr1 == end1;
}